

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O3

atf_error_t atf_tc_set_md_var(atf_tc_t *tc,char *key,char *value,...)

{
  size_t *psVar1;
  atf_tc_impl_s_ *paVar2;
  size_t sVar3;
  int iVar4;
  size_t __n;
  size_t sVar5;
  
  __n = strlen(key);
  paVar2 = tc->impl_;
  sVar3 = paVar2->variables_size;
  if (sVar3 != 0) {
    sVar5 = 0;
    do {
      iVar4 = strncmp(paVar2->variables_key[sVar5],key,__n);
      if (iVar4 == 0) {
        paVar2->variables_value[sVar5] = value;
        return (atf_error_t)0x0;
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
    if (sVar3 == 0x80) {
      return (atf_error_t)0x4;
    }
  }
  paVar2->variables_key[sVar3] = key;
  tc->impl_->variables_value[tc->impl_->variables_size] = value;
  psVar1 = &tc->impl_->variables_size;
  *psVar1 = *psVar1 + 1;
  return (atf_error_t)0x0;
}

Assistant:

atf_error_t
atf_tc_set_md_var(atf_tc_t *tc, char const *key, char const *value, ...)
{
	size_t key_length = strlen(key);

	for (size_t i = 0; i < tc->impl_->variables_size; ++i) {
		if (strncmp(tc->impl_->variables_key[i], /**/
			key, key_length) == 0) {
			tc->impl_->variables_value[i] = value;
			return atf_no_error();
		}
	}

	if (tc->impl_->variables_size == 128) {
		return microatf_error_too_many_variables();
	}

	tc->impl_->variables_key[tc->impl_->variables_size] = key;
	tc->impl_->variables_value[tc->impl_->variables_size] = value;

	++tc->impl_->variables_size;

	return atf_no_error();
}